

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Ses_StoreAddEntry(Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char *pSol,
                     int fResLimit)

{
  long *plVar1;
  Ses_TimesEntry_t *pTimes2;
  byte bVar2;
  uint uVar3;
  int iVar4;
  Ses_TruthEntry_t *pEntry;
  Ses_TimesEntry_t *pSVar5;
  long lVar6;
  Ses_TimesEntry_t **ppSVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int fUnsynthImp;
  int fUnsynthRL;
  Ses_TruthEntry_t **ppSVar12;
  Ses_TimesEntry_t **ppSVar13;
  Ses_TruthEntry_t **ppSVar14;
  
  fUnsynthImp = (int)pSol;
  fUnsynthRL = fResLimit;
  if (pSol != (char *)0x0) {
    Abc_ExactNormalizeArrivalTimesForNetwork(nVars,pArrTimeProfile,pSol);
  }
  uVar3 = Ses_StoreTableHash(pTruth,nVars);
  ppSVar14 = pStore->pEntries + uVar3;
  ppSVar12 = ppSVar14;
  while (pEntry = *ppSVar12, pEntry != (Ses_TruthEntry_t *)0x0) {
    iVar4 = Ses_StoreTruthEqual(pEntry,pTruth,nVars);
    if (iVar4 != 0) goto LAB_0028031c;
    ppSVar12 = &pEntry->next;
  }
  pEntry = (Ses_TruthEntry_t *)calloc(1,0x38);
  bVar2 = (char)nVars - 6U & 0x1f;
  uVar10 = 0;
  uVar8 = (ulong)(uint)(1 << bVar2);
  if (1 << bVar2 < 1) {
    uVar8 = uVar10;
  }
  pEntry->nVars = nVars;
  if (nVars < 7) {
    uVar8 = 1;
  }
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    pEntry->pTruth[uVar10] = pTruth[uVar10];
  }
  pEntry->next = *ppSVar14;
  *ppSVar14 = pEntry;
LAB_0028031c:
  ppSVar13 = &pEntry->head;
  ppSVar7 = ppSVar13;
LAB_00280328:
  pTimes2 = *ppSVar7;
  if (pTimes2 != (Ses_TimesEntry_t *)0x0) goto code_r0x00280330;
  pSVar5 = (Ses_TimesEntry_t *)calloc(1,0x38);
  uVar8 = 0;
  uVar10 = 0;
  if (0 < nVars) {
    uVar10 = (ulong)(uint)nVars;
  }
  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    pSVar5->pArrTimeProfile[uVar8] = pArrTimeProfile[uVar8];
  }
  pSVar5->pNetwork = pSol;
  pSVar5->fResLimit = fResLimit;
  pSVar5->next = *ppSVar13;
  *ppSVar13 = pSVar5;
  pStore->nEntriesCount = pStore->nEntriesCount + 1;
  iVar4 = 1;
  if (pSol != (char *)0x0) {
    pStore->nValidEntriesCount = pStore->nValidEntriesCount + 1;
    goto LAB_002803a4;
  }
  goto LAB_002803c0;
code_r0x00280330:
  iVar4 = Ses_StoreTimesEqual(pArrTimeProfile,pTimes2->pArrTimeProfile,nVars);
  ppSVar7 = &pTimes2->next;
  if (iVar4 != 0) {
    iVar4 = 0;
    if (pSol == (char *)0x0) {
LAB_002803c0:
      lVar6 = 0x20d0;
      if (fResLimit == 0) {
        lVar6 = 0x2080;
      }
      lVar11 = 0x2088;
      lVar9 = 0x20d8;
    }
    else {
LAB_002803a4:
      lVar6 = 0x21c0;
      if (fResLimit == 0) {
        lVar6 = 0x2170;
      }
      lVar11 = 0x2178;
      lVar9 = 0x21c8;
    }
    if (fResLimit == 0) {
      lVar9 = lVar11;
    }
    plVar1 = (long *)((long)pStore->pEntries + lVar6 + -0x18);
    *plVar1 = *plVar1 + 1;
    lVar6 = (long)pStore->pEntries + lVar9 + -0x18;
    plVar1 = (long *)(lVar6 + (long)nVars * 8);
    *plVar1 = *plVar1 + 1;
    if ((pTimes2 == (Ses_TimesEntry_t *)0x0) && (pStore->szDBName != (char *)0x0)) {
      Ses_StoreWrite(pStore,pStore->szDBName,nVars,(int)lVar6,fUnsynthImp,fUnsynthRL);
    }
    return iVar4;
  }
  goto LAB_00280328;
}

Assistant:

int Ses_StoreAddEntry( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char * pSol, int fResLimit )
{
    int key, fAdded;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;

    if ( pSol )
        Abc_ExactNormalizeArrivalTimesForNetwork( nVars, pArrTimeProfile, pSol );

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* does truth table already exist? */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* entry does not yet exist, so create new one and enqueue */
    if ( !pTEntry )
    {
        pTEntry = ABC_CALLOC( Ses_TruthEntry_t, 1 );
        Ses_StoreTruthCopy( pTEntry, pTruth, nVars );
        pTEntry->next = pStore->pEntries[key];
        pStore->pEntries[key] = pTEntry;
    }

    /* does arrival time already exist? */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* entry does not yet exist, so create new one and enqueue */
    if ( !pTiEntry )
    {
        pTiEntry = ABC_CALLOC( Ses_TimesEntry_t, 1 );
        Ses_StoreTimesCopy( pTiEntry->pArrTimeProfile, pArrTimeProfile, nVars );
        pTiEntry->pNetwork = pSol;
        pTiEntry->fResLimit = fResLimit;
        pTiEntry->next = pTEntry->head;
        pTEntry->head = pTiEntry;

        /* item has been added */
        fAdded = 1;
        pStore->nEntriesCount++;
        if ( pSol )
            pStore->nValidEntriesCount++;
    }
    else
    {
        //assert( 0 );
        /* item was already present */
        fAdded = 0;
    }

    /* statistics */
    if ( pSol )
    {
        if ( fResLimit )
        {
            pStore->nSynthesizedRL++;
            pStore->pSynthesizedRL[nVars]++;
        }
        else
        {
            pStore->nSynthesizedImp++;
            pStore->pSynthesizedImp[nVars]++;
        }
    }
    else
    {
        if ( fResLimit )
        {
            pStore->nUnsynthesizedRL++;
            pStore->pUnsynthesizedRL[nVars]++;
        }
        else
        {
            pStore->nUnsynthesizedImp++;
            pStore->pUnsynthesizedImp[nVars]++;
        }
    }

    if ( fAdded && pStore->szDBName )
        Ses_StoreWrite( pStore, pStore->szDBName, 1, 0, 0, 0 );

    return fAdded;
}